

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O1

uint __thiscall Fossilize::CLIParser::next_uint(CLIParser *this)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  string *psVar4;
  int *piVar5;
  char *extraout_RAX;
  char *pcVar6;
  ulong __code;
  __node_base_ptr p_Var7;
  uint uVar8;
  CLIParser *unaff_RBX;
  ulong unaff_RBP;
  key_type *in_RSI;
  char *pcVar9;
  string *unaff_R14;
  uint *unaff_R15;
  allocator aStack_c1;
  double dStack_c0;
  undefined1 auStack_b8 [8];
  char *pcStack_b0;
  char acStack_a0 [16];
  CLIParser *pCStack_90;
  string *psStack_80;
  uint *puStack_78;
  code *pcStack_70;
  allocator local_59;
  undefined1 local_58 [8];
  char *local_50;
  char local_40 [16];
  
  if (this->argc == 0) {
    pcStack_70 = (code *)0x14f1d1;
    next_uint();
LAB_0014f1d1:
    psVar4 = unaff_R14;
    pcVar9 = "stoul";
    pcStack_70 = (code *)0x14f1dd;
    std::__throw_invalid_argument("stoul");
  }
  else {
    pcStack_70 = (code *)0x14f13f;
    std::__cxx11::string::string((string *)&local_50,*this->argv,&local_59);
    pcVar9 = local_50;
    pcStack_70 = (code *)0x14f147;
    unaff_R15 = (uint *)__errno_location();
    uVar8 = *unaff_R15;
    unaff_RBP = (ulong)uVar8;
    *unaff_R15 = 0;
    in_RSI = (key_type *)local_58;
    pcStack_70 = (code *)0x14f167;
    psVar4 = (string *)strtoul(pcVar9,(char **)in_RSI,10);
    unaff_RBX = this;
    unaff_R14 = (string *)&local_50;
    if (local_58 == (undefined1  [8])pcVar9) goto LAB_0014f1d1;
    if (*unaff_R15 == 0) {
LAB_0014f188:
      *unaff_R15 = uVar8;
    }
    else if (*unaff_R15 == 0x22) {
      pcStack_70 = (code *)0x14f188;
      std::__throw_out_of_range("stoul");
      goto LAB_0014f188;
    }
    if (local_50 != local_40) {
      in_RSI = (key_type *)(local_40._0_8_ + 1);
      pcStack_70 = (code *)0x14f1a6;
      operator_delete(local_50,(ulong)in_RSI);
    }
    pcVar9 = local_50;
    if ((ulong)psVar4 >> 0x20 == 0) {
      this->argc = this->argc + -1;
      this->argv = this->argv + 1;
      return (uint)psVar4;
    }
  }
  pcStack_70 = next_double;
  next_uint();
  pCStack_90 = unaff_RBX;
  psStack_80 = psVar4;
  puStack_78 = unaff_R15;
  pcStack_70 = (code *)unaff_RBP;
  if (*(int *)(pcVar9 + 0x78) == 0) {
    next_double();
LAB_0014f29f:
    pcVar9 = "stod";
    std::__throw_invalid_argument("stod");
    iVar1 = (int)((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)((long)pcVar9 + 0x70))->_M_bucket_count;
    if (iVar1 != 0) {
      p_Var2 = (((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)pcVar9 + 0x70))->_M_before_begin)._M_nxt;
      p_Var3 = p_Var2->_M_nxt;
      *(int *)&((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)pcVar9 + 0x70))->_M_bucket_count = iVar1 + -1;
      (((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)((long)pcVar9 + 0x70))->_M_before_begin)._M_nxt = p_Var2 + 1;
      return (uint)p_Var3;
    }
    next_string();
    __code = std::_Hash_bytes((in_RSI->_M_dataplus)._M_p,in_RSI->_M_string_length,0xc70f6907);
    uVar8 = 0;
    p_Var7 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)pcVar9,
                        __code % ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)pcVar9)->_M_bucket_count,in_RSI,__code);
    if (p_Var7 != (__node_base_ptr)0x0) {
      uVar8 = (uint)p_Var7->_M_nxt;
    }
    return uVar8;
  }
  std::__cxx11::string::string
            ((string *)&pcStack_b0,(char *)**(undefined8 **)(pcVar9 + 0x80),&aStack_c1);
  pcVar6 = pcStack_b0;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  in_RSI = (key_type *)auStack_b8;
  dStack_c0 = strtod(pcVar6,(char **)in_RSI);
  if (auStack_b8 == (undefined1  [8])pcVar6) goto LAB_0014f29f;
  if (*piVar5 != 0) {
    if (*piVar5 != 0x22) goto LAB_0014f25b;
    dStack_c0 = (double)std::__throw_out_of_range("stod");
  }
  *piVar5 = iVar1;
LAB_0014f25b:
  pcVar6 = acStack_a0;
  if (pcStack_b0 != pcVar6) {
    operator_delete(pcStack_b0,acStack_a0._0_8_ + 1);
    pcVar6 = extraout_RAX;
  }
  *(int *)(pcVar9 + 0x78) = *(int *)(pcVar9 + 0x78) + -1;
  *(long *)(pcVar9 + 0x80) = *(long *)(pcVar9 + 0x80) + 8;
  return (uint)pcVar6;
}

Assistant:

unsigned CLIParser::next_uint()
{
	if (!argc)
	{
		LOGE("Tried to parse uint, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	auto val = stoul(*argv);
	if (val > numeric_limits<unsigned>::max())
	{
		LOGE("next_uint() out of range.\n");
		exit(EXIT_FAILURE);
	}

	argc--;
	argv++;

	return unsigned(val);
}